

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O3

bool __thiscall CppJieba::MixSegment::dispose(MixSegment *this)

{
  if ((this->super_SegmentBase)._isInited == true) {
    if ((this->_mpSeg).super_SegmentBase._isInited == true) {
      Trie::dispose(&(this->_mpSeg)._trie);
      (this->_mpSeg).super_SegmentBase._isInited = false;
    }
    (this->_hmmSeg).super_SegmentBase._isInited = false;
    (this->super_SegmentBase)._isInited = false;
  }
  return true;
}

Assistant:

virtual bool dispose()
            {
                if(!_getInitFlag())
                {
                    return true;
                }
                _mpSeg.dispose();
                _hmmSeg.dispose();
                _setInitFlag(false);
                return true;
            }